

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network_data.cpp
# Opt level: O0

void __thiscall
ot::commissioner::ActiveOperationalDataset::ActiveOperationalDataset(ActiveOperationalDataset *this)

{
  Timestamp TVar1;
  ActiveOperationalDataset *this_local;
  
  TVar1 = Timestamp::Cur();
  this->mActiveTimestamp = TVar1;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->mExtendedPanId);
  std::__cxx11::string::string((string *)&this->mNetworkName);
  std::
  vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>::
  vector(&this->mChannelMask);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->mMeshLocalPrefix);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->mNetworkMasterKey);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->mPSKc);
  SecurityPolicy::SecurityPolicy(&this->mSecurityPolicy);
  this->mPresentFlags = 0x8000;
  return;
}

Assistant:

ActiveOperationalDataset::ActiveOperationalDataset()
    : mActiveTimestamp(Timestamp::Cur())
    , mPresentFlags(kActiveTimestampBit)
{
}